

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O0

void __thiscall cmLinkImplItem::cmLinkImplItem(cmLinkImplItem *this,cmLinkImplItem *r)

{
  cmLinkImplItem *r_local;
  cmLinkImplItem *this_local;
  
  cmLinkItem::cmLinkItem(&this->super_cmLinkItem,&r->super_cmLinkItem);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,&r->Backtrace);
  this->FromGenex = (bool)(r->FromGenex & 1);
  return;
}

Assistant:

cmLinkImplItem(cmLinkImplItem const& r):
    cmLinkItem(r), Backtrace(r.Backtrace), FromGenex(r.FromGenex) {}